

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  int p1;
  byte bVar1;
  ushort uVar2;
  int iCur;
  Table *pTab;
  sqlite3 *db;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vdbe *p;
  KeyInfo *zP4;
  undefined4 extraout_var;
  Parse *pPVar7;
  int local_60;
  int iPartIdxLabel;
  undefined8 local_38;
  
  pTab = pIndex->pTable;
  iCur = pParse->nTab;
  pParse->nTab = iCur + 2;
  db = pParse->db;
  iVar3 = sqlite3SchemaToIndex(db,pIndex->pSchema);
  iVar4 = sqlite3AuthCheck(pParse,0x1b,pIndex->zName,(char *)0x0,db->aDb[iVar3].zDbSName);
  if (iVar4 == 0) {
    sqlite3TableLock(pParse,iVar3,pTab->tnum,'\x01',pTab->zName);
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      local_60 = memRootPage;
      if (memRootPage < 0) {
        local_60 = pIndex->tnum;
      }
      zP4 = sqlite3KeyInfoOfIndex(pParse,pIndex);
      iVar4 = pParse->nTab;
      pParse->nTab = iVar4 + 1;
      uVar2 = pIndex->nKeyCol;
      if (zP4 != (KeyInfo *)0x0) {
        zP4->nRef = zP4->nRef + 1;
      }
      p1 = iCur + 1;
      sqlite3VdbeAddOp4(p,0x72,iVar4,0,(uint)uVar2,(char *)zP4,-9);
      sqlite3OpenTable(pParse,iCur,iVar3,pTab,0x6c);
      iVar5 = sqlite3VdbeAddOp2(p,0x24,iCur,0);
      local_38 = CONCAT44(extraout_var,iVar5);
      iVar5 = sqlite3GetTempReg(pParse);
      pPVar7 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar7 = pParse;
      }
      pPVar7->isMultiWrite = '\x01';
      sqlite3GenerateIndexKey(pParse,pIndex,iCur,iVar5,0,&iPartIdxLabel,(Index *)0x0,0);
      sqlite3VdbeAddOp2(p,0x83,iVar4,iVar5);
      sqlite3ResolvePartIdxLabel(pParse,iPartIdxLabel);
      iVar6 = (int)local_38;
      sqlite3VdbeAddOp2(p,5,iCur,iVar6 + 1);
      sqlite3VdbeJumpHere(p,iVar6);
      if (memRootPage < 0) {
        sqlite3VdbeAddOp2(p,0x89,local_60,iVar3);
      }
      sqlite3VdbeAddOp4(p,0x6d,p1,local_60,iVar3,(char *)zP4,-9);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)(-1 < memRootPage) * 0x10 + 1;
      }
      iVar3 = sqlite3VdbeAddOp2(p,0x22,iVar4,0);
      if (pIndex->onError == '\0') {
        local_60 = p->nOp;
      }
      else {
        iVar6 = sqlite3VdbeGoto(p,1);
        local_60 = p->nOp;
        sqlite3VdbeAddOp4Int(p,0x7d,iVar4,iVar6,iVar5,(uint)pIndex->nKeyCol);
        sqlite3UniqueConstraint(pParse,2,pIndex);
        sqlite3VdbeJumpHere(p,iVar6);
      }
      sqlite3VdbeAddOp3(p,0x7e,iVar4,iVar5,p1);
      sqlite3VdbeAddOp1(p,0x82,p1);
      sqlite3VdbeAddOp2(p,0x84,p1,iVar5);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 0x10;
      }
      if (iVar5 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar5;
        }
      }
      sqlite3VdbeAddOp2(p,3,iVar4,local_60);
      sqlite3VdbeJumpHere(p,iVar3);
      sqlite3VdbeAddOp1(p,0x75,iCur);
      sqlite3VdbeAddOp1(p,0x75,p1);
      sqlite3VdbeAddOp1(p,0x75,iVar4);
    }
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  int tnum;                      /* Root page of index */
  int iPartIdxLabel;             /* Jump to this label to skip a row */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assembled index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = memRootPage;
  }else{
    tnum = pIndex->tnum;
  }
  pKey = sqlite3KeyInfoOfIndex(pParse, pIndex);
  assert( pKey!=0 || db->mallocFailed || pParse->nErr );

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, pIndex->nKeyCol, (char*)
                    sqlite3KeyInfoRef(pKey), P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0); VdbeCoverage(v);
  regRecord = sqlite3GetTempReg(pParse);
  sqlite3MultiWrite(pParse);

  sqlite3GenerateIndexKey(pParse,pIndex,iTab,regRecord,0,&iPartIdxLabel,0,0);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);
  if( memRootPage<0 ) sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, tnum, iDb, 
                    (char *)pKey, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0); VdbeCoverage(v);
  if( IsUniqueIndex(pIndex) ){
    int j2 = sqlite3VdbeGoto(v, 1);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeVerifyAbortable(v, OE_Abort);
    sqlite3VdbeAddOp4Int(v, OP_SorterCompare, iSorter, j2, regRecord,
                         pIndex->nKeyCol); VdbeCoverage(v);
    sqlite3UniqueConstraint(pParse, OE_Abort, pIndex);
    sqlite3VdbeJumpHere(v, j2);
  }else{
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp3(v, OP_SorterData, iSorter, regRecord, iIdx);
  sqlite3VdbeAddOp1(v, OP_SeekEnd, iIdx);
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iIdx, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}